

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::
optional<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>>::
initialize<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>>
          (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>> *this,
          Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *value)

{
  if (*this != (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>>)
               0x1) {
    tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>::Animatable
              ((Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>, V = tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }